

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::TextureCubeView::gatherCompare
          (TextureCubeView *this,Sampler *sampler,float ref,float s,float t,float r)

{
  undefined4 uVar1;
  TextureChannelClass TVar2;
  undefined8 *in_RDX;
  long lVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  Vec4 VVar8;
  Vec4 gathered;
  Sampler noCompareSampler;
  TextureCubeView local_78;
  undefined4 uStack_40;
  undefined4 local_3c;
  undefined4 uStack_38;
  undefined8 uStack_34;
  
  local_78.m_levels[1] = (ConstPixelBufferAccess *)*in_RDX;
  local_78.m_levels[2] = (ConstPixelBufferAccess *)in_RDX[1];
  local_78.m_levels[3] = (ConstPixelBufferAccess *)in_RDX[2];
  local_78.m_levels[5] = (ConstPixelBufferAccess *)in_RDX[4];
  uStack_34 = *(undefined8 *)((long)in_RDX + 0x34);
  uStack_38 = (undefined4)((ulong)*(undefined8 *)((long)in_RDX + 0x2c) >> 0x20);
  uStack_40 = (undefined4)in_RDX[5];
  local_3c = (undefined4)((ulong)in_RDX[5] >> 0x20);
  local_78.m_levels[4] = (ConstPixelBufferAccess *)(in_RDX[3] & 0xffffffff);
  lVar3 = 0;
  gather(&local_78,sampler,s,t,r,(int)&local_78 + 0x10);
  TVar2 = getTextureChannelClass(*(ChannelType *)(*(long *)&sampler->wrapR + 4));
  *(undefined8 *)this = 0;
  this->m_levels[0] = (ConstPixelBufferAccess *)0x0;
  uVar1 = *(undefined4 *)((long)in_RDX + 0x1c);
  fVar4 = 1.0;
  if (ref <= 1.0) {
    fVar4 = ref;
  }
  do {
    fVar7 = *(float *)((long)local_78.m_levels + lVar3 * 4 + -8);
    fVar5 = ref;
    if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      fVar5 = 1.0;
      if (fVar7 <= 1.0) {
        fVar5 = fVar7;
      }
      fVar7 = (float)(~-(uint)(fVar7 < 0.0) & (uint)fVar5);
      fVar5 = (float)(~-(uint)(ref < 0.0) & (uint)fVar4);
    }
    uVar6 = 0;
    switch(uVar1) {
    case 1:
      if (fVar5 < fVar7) goto switchD_0015c954_caseD_7;
      break;
    case 2:
      if (fVar5 <= fVar7) goto switchD_0015c954_caseD_7;
      break;
    case 3:
      if (fVar7 < fVar5) goto switchD_0015c954_caseD_7;
      break;
    case 4:
      if (fVar7 <= fVar5) goto switchD_0015c954_caseD_7;
      break;
    case 5:
      if ((fVar5 == fVar7) && (!NAN(fVar5) && !NAN(fVar7))) goto switchD_0015c954_caseD_7;
      break;
    case 6:
      if ((fVar5 != fVar7) || (NAN(fVar5) || NAN(fVar7))) goto switchD_0015c954_caseD_7;
      break;
    case 7:
switchD_0015c954_caseD_7:
      uVar6 = 0x3f800000;
    }
    *(undefined4 *)((long)this->m_levels + lVar3 * 4 + -8) = uVar6;
    lVar3 = lVar3 + 1;
    if (lVar3 == 4) {
      VVar8.m_data[3] = 0.0;
      VVar8.m_data[0] = 1.0;
      VVar8.m_data[1] = 0.0;
      VVar8.m_data[2] = 0.0;
      return (Vec4)VVar8.m_data;
    }
  } while( true );
}

Assistant:

Vec4 TextureCubeView::gatherCompare (const Sampler& sampler, float ref, float s, float t, float r) const
{
	DE_ASSERT(sampler.compare != Sampler::COMPAREMODE_NONE);
	DE_ASSERT(m_levels[0][0].getFormat().order == TextureFormat::D || m_levels[0][0].getFormat().order == TextureFormat::DS);
	DE_ASSERT(sampler.compareChannel == 0);

	Sampler noCompareSampler = sampler;
	noCompareSampler.compare = Sampler::COMPAREMODE_NONE;

	const Vec4 gathered			= gather(noCompareSampler, s, t, r, 0 /* component 0: depth */);
	const bool isFixedPoint		= isFixedPointDepthTextureFormat(m_levels[0][0].getFormat());
	Vec4 result;
	for (int i = 0; i < 4; i++)
		result[i] = execCompare(gathered, sampler.compare, i, ref, isFixedPoint);

	return result;
}